

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

bool __thiscall flatbuffers::dart::DartGenerator::generate(DartGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  _Rb_tree_node_base *__rhs;
  _Rb_tree_node_base *__lhs_00;
  __type _Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  char *__rhs_00;
  _Base_ptr p_Var4;
  IncludedFile *included_file;
  _Alloc_hider _Var5;
  string code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string import_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  namespace_code_map namespace_code;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  imports;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  code._M_dataplus._M_p = (pointer)&code.field_2;
  code._M_string_length = 0;
  code.field_2._M_local_buf[0] = '\0';
  namespace_code._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &namespace_code._M_t._M_impl.super__Rb_tree_header._M_header;
  namespace_code._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  namespace_code._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  namespace_code._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       namespace_code._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GenerateEnums(this,&namespace_code);
  GenerateStructs(this,&namespace_code);
  imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &imports._M_t._M_impl.super__Rb_tree_header._M_header;
  imports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  imports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  imports._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  imports._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Parser::GetIncludedFiles
            ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
             &import_code,(this->super_BaseGenerator).parser_);
  for (_Var5 = import_code._M_dataplus; _Var5._M_p != (pointer)import_code._M_string_length;
      _Var5._M_p = _Var5._M_p + 0x40) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(_Var5._M_p + 0x20)
    ;
    _Var1 = std::operator==(__lhs,&((this->super_BaseGenerator).parser_)->file_being_parsed_);
    if (!_Var1) {
      import_generator<flatbuffers::StructDef>
                (this,&(((this->super_BaseGenerator).parser_)->structs_).vec,__lhs,&imports);
      import_generator<flatbuffers::EnumDef>
                (this,&(((this->super_BaseGenerator).parser_)->enums_).vec,__lhs,&imports);
    }
  }
  std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::~vector
            ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
             &import_code);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&import_code,"",(allocator<char> *)&local_110);
  for (p_Var3 = imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &imports._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::append((string *)&import_code);
  }
  std::__cxx11::string::append((char *)&import_code);
  for (p_Var3 = namespace_code._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &namespace_code._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    code._M_string_length = 0;
    *code._M_dataplus._M_p = '\0';
    std::operator+(&local_130,&code,"// ");
    __rhs_00 = BaseGenerator::FlatBuffersGeneratedWarning();
    std::operator+(&local_178,&local_130,__rhs_00);
    std::operator+(&local_110,&local_178,"\n");
    std::__cxx11::string::operator=((string *)&code,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_130);
    std::operator+(&local_110,&code,
                   "// ignore_for_file: unused_import, unused_field, unused_element, unused_local_variable\n\n"
                  );
    std::__cxx11::string::operator=((string *)&code,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    __rhs = p_Var3 + 1;
    if (p_Var3[1]._M_parent != (_Base_ptr)0x0) {
      std::operator+(&local_178,"library ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&local_110,&local_178,";\n\n");
      std::__cxx11::string::append((string *)&code);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_178);
    }
    std::__cxx11::string::append((char *)&code);
    std::operator+(&local_178,"import \'package:flat_buffers/flat_buffers.dart\' as ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _kFb_abi_cxx11_);
    std::operator+(&local_110,&local_178,";\n\n");
    std::__cxx11::string::append((string *)&code);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_178);
    for (p_Var4 = namespace_code._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &namespace_code._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      __lhs_00 = p_Var4 + 1;
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs);
      if (bVar2) {
        Filename(&local_70,this,(string *)__lhs_00,false);
        std::operator+(&local_50,"import \'./",&local_70);
        std::operator+(&local_130,&local_50,"\' as ");
        ImportAliasName(&local_90,(string *)__lhs_00);
        std::operator+(&local_178,&local_130,&local_90);
        std::operator+(&local_110,&local_178,";\n");
        std::__cxx11::string::append((string *)&code);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    std::__cxx11::string::append((char *)&code);
    std::__cxx11::string::append((string *)&code);
    std::__cxx11::string::append((string *)&code);
    Filename(&local_110,this,(string *)__rhs,true);
    bVar2 = SaveFile(local_110._M_dataplus._M_p,&code,false);
    std::__cxx11::string::~string((string *)&local_110);
    if (!bVar2) break;
  }
  std::__cxx11::string::~string((string *)&import_code);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&imports._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&namespace_code._M_t);
  std::__cxx11::string::~string((string *)&code);
  return (_Rb_tree_header *)p_Var3 == &namespace_code._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool generate() {
    std::string code;
    namespace_code_map namespace_code;
    GenerateEnums(namespace_code);
    GenerateStructs(namespace_code);

    std::set<std::string> imports;

    for (const auto &included_file : parser_.GetIncludedFiles()) {
      if (included_file.filename == parser_.file_being_parsed_) continue;

      import_generator(parser_.structs_.vec, included_file.filename, imports);
      import_generator(parser_.enums_.vec, included_file.filename, imports);
    }

    std::string import_code = "";
    for (const auto &file : imports) { import_code += file; }

    import_code += import_code.empty() ? "" : "\n";

    for (auto kv = namespace_code.begin(); kv != namespace_code.end(); ++kv) {
      code.clear();
      code = code + "// " + FlatBuffersGeneratedWarning() + "\n";
      code = code +
             "// ignore_for_file: unused_import, unused_field, unused_element, "
             "unused_local_variable\n\n";

      if (!kv->first.empty()) { code += "library " + kv->first + ";\n\n"; }

      code += "import 'dart:typed_data' show Uint8List;\n";
      code += "import 'package:flat_buffers/flat_buffers.dart' as " + _kFb +
              ";\n\n";

      for (auto kv2 = namespace_code.begin(); kv2 != namespace_code.end();
           ++kv2) {
        if (kv2->first != kv->first) {
          code += "import './" + Filename(kv2->first, /*path=*/false) +
                  "' as " + ImportAliasName(kv2->first) + ";\n";
        }
      }

      code += "\n";
      code += import_code;

      code += kv->second;

      if (!SaveFile(Filename(kv->first).c_str(), code, false)) { return false; }
    }
    return true;
  }